

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_sectionstyle.cpp
# Opt level: O0

bool __thiscall ON_SectionStyle::IsValid(ON_SectionStyle *this,ON_TextLog *text_log)

{
  bool bVar1;
  double dVar2;
  ON_TextLog *text_log_local;
  ON_SectionStyle *this_local;
  
  bVar1 = ON_ModelComponent::IsValid(&this->super_ON_ModelComponent,text_log);
  if (bVar1) {
    dVar2 = BoundaryWidthScale(this);
    if (0.0 < dVar2) {
      dVar2 = HatchScale(this);
      if (0.0 < dVar2) {
        this_local._7_1_ = true;
      }
      else {
        if (text_log != (ON_TextLog *)0x0) {
          ON_TextLog::Print(text_log,"ON_SectionStyle::SectionHatchScale <= 0\n");
        }
        this_local._7_1_ = false;
      }
    }
    else {
      if (text_log != (ON_TextLog *)0x0) {
        ON_TextLog::Print(text_log,"ON_SectionStyle::BoundaryWidthScale <= 0\n");
      }
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ON_SectionStyle::IsValid( ON_TextLog* text_log ) const
{
  if (false == ON_ModelComponent::IsValid(text_log))
    return false;

  // An ON_SectionStyle with an empty name is valid.
  if (BoundaryWidthScale() <= 0)
  {
    if ( text_log )
      text_log->Print("ON_SectionStyle::BoundaryWidthScale <= 0\n");
    return false;
  }

  if (HatchScale() <= 0)
  {
    if (text_log)
      text_log->Print("ON_SectionStyle::SectionHatchScale <= 0\n");
    return false;
  }

  return true;
}